

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

size_t Qiniu_Rd_Reader_Callback(char *buffer,size_t size,size_t nitems,void *userData)

{
  int iVar1;
  Qiniu_Rd_Reader *rdr;
  ssize_t ret;
  void *userData_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  buffer_local = (char *)Qiniu_File_ReadAt(*userData,buffer,size * nitems,
                                           *(Qiniu_Off_T *)((long)userData + 8));
  if ((long)buffer_local < 0) {
    *(undefined4 *)((long)userData + 0x10) = 2;
    buffer_local = (char *)0x10000000;
  }
  else {
    if ((*(long *)((long)userData + 0x20) != 0) &&
       (iVar1 = (**(code **)((long)userData + 0x20))
                          (*(undefined8 *)((long)userData + 0x18),buffer,buffer_local), iVar1 != 0))
    {
      *(undefined4 *)((long)userData + 0x10) = 1;
      return 0x10000000;
    }
    *(char **)((long)userData + 8) = buffer_local + *(long *)((long)userData + 8);
  }
  return (size_t)buffer_local;
}

Assistant:

QINIU_DLLAPI size_t Qiniu_Rd_Reader_Callback(char * buffer, size_t size, size_t nitems, void * userData)
{
	ssize_t ret;
	Qiniu_Rd_Reader * rdr = (Qiniu_Rd_Reader *)userData;

	ret = Qiniu_File_ReadAt(rdr->file, buffer, size * nitems, rdr->offset);
	if (ret < 0) {
		rdr->status = QINIU_RD_ABORT_BY_READAT;
		return CURL_READFUNC_ABORT;
	} // if

	if (rdr->abortCallback && rdr->abortCallback(rdr->abortUserData, buffer, ret)) {
		rdr->status = QINIU_RD_ABORT_BY_CALLBACK;
		return CURL_READFUNC_ABORT;
	} // if

	rdr->offset += ret;
	return ret;
}